

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uchar *puVar2;
  size_t __size;
  ucvector v;
  ucvector local_48;
  
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    local_48.data = *out;
    local_48.allocsize = *outsize;
    local_48.size = local_48.allocsize;
    if (expected_size != 0) {
      local_48.size = expected_size + local_48.allocsize;
      if (local_48.allocsize < local_48.size) {
        __size = (local_48.allocsize >> 1) + local_48.size;
        puVar2 = (uchar *)realloc(local_48.data,__size);
        if (puVar2 != (uchar *)0x0) {
          local_48.data = puVar2;
          local_48.allocsize = __size;
        }
      }
      local_48.size = *outsize;
    }
    uVar1 = lodepng_zlib_decompressv(&local_48,in,insize,settings);
    *out = local_48.data;
    *outsize = local_48.size;
  }
  else {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else if (settings->max_output_size == 0) {
      uVar1 = 0x6e;
    }
    else {
      uVar1 = 0x6e - (settings->max_output_size < *outsize);
    }
  }
  return uVar1;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  unsigned error;
  if(settings->custom_zlib) {
    error = settings->custom_zlib(out, outsize, in, insize, settings);
    if(error) {
      /*the custom zlib is allowed to have its own error codes, however, we translate it to code 110*/
      error = 110;
      /*if there's a max output size, and the custom zlib returned error, then indicate that error instead*/
      if(settings->max_output_size && *outsize > settings->max_output_size) error = 109;
    }
  } else {
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
  }
  return error;
}